

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Peeps.cpp
# Opt level: O2

LabelInstr * Peeps::RetargetBrToBr(BranchInstr *branchInstr,LabelInstr *targetInstr)

{
  undefined1 *puVar1;
  Opnd *pOVar2;
  LabelInstr *labelInstr;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  Instr *this;
  BranchInstr *this_00;
  BranchInstr *this_01;
  MultiBranchInstr *this_02;
  uint uVar6;
  LabelInstr *local_38;
  
  if (targetInstr == (LabelInstr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31b,"(targetInstr)","targetInstr");
    if (!bVar4) goto LAB_005ae12d;
    *puVar5 = 0;
  }
  this = IR::Instr::GetNextRealInstr(&targetInstr->super_Instr);
  if (this == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                       ,0x31d,"(targetInstrNext)","GetNextRealInstr() failed to get next target");
    if (!bVar4) {
LAB_005ae12d:
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (MDStart < (branchInstr->super_Instr).m_opcode) {
    uVar6 = 1;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    local_38 = (LabelInstr *)0x0;
    while (this->m_kind == InstrKindBranch) {
      this_00 = IR::Instr::AsBranchInstr(this);
      this_01 = IR::Instr::AsBranchInstr(this);
      bVar4 = IR::BranchInstr::IsUnconditional(this_01);
      if (!bVar4) {
        if (this->m_opcode != (branchInstr->super_Instr).m_opcode) {
          return targetInstr;
        }
        pOVar2 = (branchInstr->super_Instr).m_src1;
        if (pOVar2 == (Opnd *)0x0) {
LAB_005adf8d:
          if (this->m_src1 != (Opnd *)0x0) {
            return targetInstr;
          }
        }
        else {
          if (this->m_src1 == (Opnd *)0x0) {
            return targetInstr;
          }
          bVar4 = IR::Opnd::IsEqual(pOVar2,this->m_src1);
          if (!bVar4) {
            if ((branchInstr->super_Instr).m_src1 != (Opnd *)0x0) {
              return targetInstr;
            }
            goto LAB_005adf8d;
          }
        }
        pOVar2 = (branchInstr->super_Instr).m_src2;
        if (pOVar2 != (Opnd *)0x0) {
          if (this->m_src2 == (Opnd *)0x0) {
            return targetInstr;
          }
          bVar4 = IR::Opnd::IsEqual(pOVar2,this->m_src2);
          if (bVar4) goto LAB_005adfcd;
          if ((branchInstr->super_Instr).m_src2 != (Opnd *)0x0) {
            return targetInstr;
          }
        }
        if (this->m_src2 != (Opnd *)0x0) {
          return targetInstr;
        }
      }
LAB_005adfcd:
      if ((targetInstr->field_0x78 & 1) != 0) {
        if ((this_00->super_Instr).m_opcode < ADD) {
          return targetInstr;
        }
        bVar4 = targetInstr == local_38;
        local_38 = targetInstr;
        if (bVar4) {
          return targetInstr;
        }
      }
      bVar4 = IR::BranchInstr::IsMultiBranch(branchInstr);
      if (((!bVar4) && ((branchInstr->m_branchTarget->field_0x78 & 0x20) != 0)) &&
         (bVar4 = IR::BranchInstr::IsMultiBranch(this_00), !bVar4)) {
        puVar1 = &this_00->m_branchTarget->field_0x78;
        *puVar1 = *puVar1 | 0x20;
      }
      if (9999 < uVar6) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,0x380,"(++counter < 10000)","We should not be looping this many times!")
        ;
        if (!bVar4) goto LAB_005ae12d;
        *puVar5 = 0;
      }
      labelInstr = this_00->m_branchTarget;
      if (labelInstr == (LabelInstr *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar5 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Peeps.cpp"
                           ,900,"(reTargetLabel)","reTargetLabel");
        if (!bVar4) goto LAB_005ae12d;
        *puVar5 = 0;
      }
      if (targetInstr == labelInstr) {
        return targetInstr;
      }
      bVar4 = IR::BranchInstr::IsMultiBranch(branchInstr);
      if (bVar4) {
        this_02 = IR::BranchInstr::AsMultiBrInstr(branchInstr);
        IR::MultiBranchInstr::ChangeLabelRef(this_02,targetInstr,labelInstr);
      }
      else {
        IR::BranchInstr::SetTarget(branchInstr,labelInstr);
      }
      if (((SListCounted<IR::BranchInstr_*,_Memory::ArenaAllocator> *)
           (targetInstr->labelRefs).
           super_SList<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListBase<IR::BranchInstr_*,_Memory::ArenaAllocator,_RealCount>.
           super_SListNodeBase<Memory::ArenaAllocator>.next == &targetInstr->labelRefs) &&
         ((targetInstr->field_0x78 & 4) == 0)) {
        PeepUnreachableLabel(targetInstr,false,(bool *)0x0);
      }
      this = IR::Instr::GetNextRealInstr(&labelInstr->super_Instr);
      uVar6 = uVar6 + 1;
      targetInstr = labelInstr;
    }
  }
  return targetInstr;
}

Assistant:

IR::LabelInstr *
Peeps::RetargetBrToBr(IR::BranchInstr *branchInstr, IR::LabelInstr * targetInstr)
{
    AnalysisAssert(targetInstr);
    IR::Instr *targetInstrNext = targetInstr->GetNextRealInstr();
    AnalysisAssertMsg(targetInstrNext, "GetNextRealInstr() failed to get next target");

    // Removing branch to branch breaks some lexical assumptions about loop in sccliveness/linearscan/second chance.
    if (!branchInstr->IsLowered())
    {
        return targetInstr;
    }

    //
    // Retarget branch-to-branch
    //
#if DBG
    uint counter = 0;
#endif

    IR::LabelInstr *lastLoopTop = NULL;

    while (true)
    {
        // There's very few cases where we can safely follow a branch chain with intervening instrs.
        // One of them, which comes up occasionally, is where there is a copy of a single-def symbol
        // to another single-def symbol which is only used for the branch instruction (i.e. one dead
        // after the branch). Another is where a single-def symbol is declared of a constant (e.g. a
        // symbol created to store "True"
        // Unfortuantely, to properly do this, we'd need to do it somewhere else (i.e. not in peeps)
        // and make use of the additional information that we'd have there. Having the flow graph or
        // just any more information about variable liveness is necessary to determine that the load
        // instructions between jumps can be safely skipped.
        // The general case where this would be useful, on a higher level, is where a long statement
        // containing many branches returns a value; the branching here can put the result into some
        // different stacksym at each level, meaning that there'd be a load between each branch. The
        // result is that we don't currently optimize it.
        IR::BranchInstr *branchAtTarget = nullptr;
        if (targetInstrNext->IsBranchInstr())
        {
            branchAtTarget = targetInstrNext->AsBranchInstr();
        }
        else
        {
            // We don't have the information here to decide whether or not to continue the branch chain.
            break;
        }
        // This used to just be a targetInstrNext->AsBranchInstr()->IsUnconditional(), but, in order
        // to optimize further, it became necessary to handle more than just unconditional jumps. In
        // order to keep the code relatively clean, the "is it an inherently-taken jump chain" check
        // code now follows here:
        if (!targetInstrNext->AsBranchInstr()->IsUnconditional())
        {
            bool safetofollow = false;
            if(targetInstrNext->m_opcode == branchInstr->m_opcode)
            {
                // If it's the same branch instruction, with the same arguments, the branch decision should,
                // similarly, be the same. There's a bit more that can be done with this (e.g. for inverted,
                // but otherwise similar instructions like brTrue and brFalse, the destination could go down
                // the other path), but this is something that should probably be done more generally, so we
                // can optimize branch chains that have other interesting bechaviors.
                if (
                    (
                        (branchInstr->GetSrc1() && targetInstrNext->GetSrc1() && branchInstr->GetSrc1()->IsEqual(targetInstrNext->GetSrc1())) ||
                        !(branchInstr->GetSrc1() || targetInstrNext->GetSrc1())
                    ) && (
                        (branchInstr->GetSrc2() && targetInstrNext->GetSrc2() && branchInstr->GetSrc2()->IsEqual(targetInstrNext->GetSrc2())) ||
                        !(branchInstr->GetSrc2() || targetInstrNext->GetSrc2())
                    )
                   )
                {
                    safetofollow = true;
                }
            }
            if (!safetofollow)
            {
                // We can't say safely that this branch is something that we can implicitly take, so instead
                // cut off the branch chain optimization here.
                break;
            }
        }

        // We don't want to skip the loop entry, unless we're right before the encoder
        if (targetInstr->m_isLoopTop && !branchAtTarget->IsLowered())
        {
            break;
        }

        if (targetInstr->m_isLoopTop)
        {
            if (targetInstr == lastLoopTop)
            {
                // We are back to a loopTop already visited.
                // Looks like an infinite loop somewhere...
                break;
            }
            lastLoopTop = targetInstr;
        }
#if DBG
        if (!branchInstr->IsMultiBranch() && branchInstr->GetTarget()->m_noHelperAssert && !branchAtTarget->IsMultiBranch())
        {
            branchAtTarget->GetTarget()->m_noHelperAssert = true;
        }

        AssertMsg(++counter < 10000, "We should not be looping this many times!");
#endif

        IR::LabelInstr * reTargetLabel = branchAtTarget->GetTarget();
        AnalysisAssert(reTargetLabel);
        if (targetInstr == reTargetLabel)
        {
            // Infinite loop.
            //    JCC $L1
            // L1:
            //    JMP $L1
            break;
        }

        if(branchInstr->IsMultiBranch())
        {
            IR::MultiBranchInstr * multiBranchInstr = branchInstr->AsMultiBrInstr();
            multiBranchInstr->ChangeLabelRef(targetInstr, reTargetLabel);
        }
        else
        {
            branchInstr->SetTarget(reTargetLabel);
        }

        if (targetInstr->IsUnreferenced())
        {
            Peeps::PeepUnreachableLabel(targetInstr, false);
        }

        targetInstr = reTargetLabel;
        targetInstrNext = targetInstr->GetNextRealInstr();
    }
    return targetInstr;
}